

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTcSymLocalBase::get_ctx_arr_idx(CTcSymLocalBase *this)

{
  CTcSymLocalBase *in_RDI;
  int local_4;
  
  if (in_RDI->ctx_orig_ == (CTcSymLocal *)0x0) {
    local_4 = in_RDI->ctx_arr_idx_;
  }
  else {
    local_4 = get_ctx_arr_idx(in_RDI);
  }
  return local_4;
}

Assistant:

int CTcSymLocalBase::get_ctx_arr_idx() const
{
    /* 
     *   if I'm based on an original symbol from another scope, use the
     *   same property ID as the original symbol 
     */
    if (ctx_orig_ != 0)
        return ctx_orig_->get_ctx_arr_idx();

    /* return my context property */
    return ctx_arr_idx_;
}